

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O3

void __thiscall
qclab::qgates::QControlledGate2<std::complex<double>_>::apply
          (QControlledGate2<std::complex<double>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<double>_> *matrix,int offset)

{
  undefined8 *puVar1;
  complex<double> *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  SquareMatrix<std::complex<double>_> *pSVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  undefined4 extraout_var;
  long lVar15;
  double dVar16;
  double dVar17;
  QControlledGate2<std::complex<double>_> *pQVar18;
  int iVar19;
  char *__assertion;
  double dVar20;
  double dVar21;
  long lVar22;
  complex<double> x1;
  complex<double> x2;
  vector<int,_std::allocator<int>_> qubits;
  double local_138;
  double dStack_130;
  SquareMatrix<std::complex<double>_> local_120;
  long local_110;
  double local_108;
  QControlledGate2<std::complex<double>_> *local_100;
  SquareMatrix<std::complex<double>_> *local_f8;
  double local_f0;
  double local_e8;
  long local_e0;
  double local_d8;
  double local_d0;
  long local_c8;
  double local_c0;
  double local_b8;
  double dStack_b0;
  double local_a0;
  double local_98;
  double dStack_90;
  complex<double> local_88;
  double local_78;
  double dStack_70;
  complex<double> local_68;
  long local_50;
  int *local_48 [2];
  long local_38;
  
  local_100 = this;
  local_f8 = matrix;
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x2e,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x2f,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject
    [5])(local_48);
  iVar12 = *local_48[0];
  *local_48[0] = iVar12 + offset;
  iVar13 = local_48[0][1];
  local_48[0][1] = offset + iVar13;
  if (iVar12 + offset < nbQubits) {
    if (offset + iVar13 < nbQubits) {
      iVar12 = (*(local_100->super_QGate2<std::complex<double>_>).
                 super_QObject<std::complex<double>_>._vptr_QObject[0x10])();
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar12) + 0x38))
                (&local_120,(long *)CONCAT44(extraout_var,iVar12));
      dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>(op,&local_120);
      iVar12 = local_100->control_;
      iVar13 = (*(local_100->super_QGate2<std::complex<double>_>).
                 super_QObject<std::complex<double>_>._vptr_QObject[0xf])();
      pQVar18 = local_100;
      if (iVar12 < iVar13) {
        iVar12 = (*(local_100->super_QGate2<std::complex<double>_>).
                   super_QObject<std::complex<double>_>._vptr_QObject[0xf])(local_100);
        iVar13 = 1 << ((char)iVar12 - (char)pQVar18->control_ & 0x1fU);
        iVar12 = (*(pQVar18->super_QGate2<std::complex<double>_>).
                   super_QObject<std::complex<double>_>._vptr_QObject[0xf])(pQVar18);
        local_d8 = (double)CONCAT44(local_d8._4_4_,iVar12);
        uVar14 = (*(pQVar18->super_QGate2<std::complex<double>_>).
                   super_QObject<std::complex<double>_>._vptr_QObject[0xf])(pQVar18);
        pSVar11 = local_f8;
        local_110 = (long)iVar13;
        local_c8 = CONCAT44(local_c8._4_4_,~uVar14 + nbQubits);
        dVar16 = (double)(long)(1 << ((byte)iVar12 & 0x1f));
        dVar20 = (double)(long)(1 << ((byte)(~uVar14 + nbQubits) & 0x1f));
        lVar15 = local_f8->size_;
        if (side == Left) {
          if (0 < lVar15) {
            local_d0 = (double)((long)dVar20 * 2);
            local_e8 = (double)(long)(iVar13 / 2);
            local_c0 = 4.94065645841247e-324;
            if (1 < (long)dVar20) {
              local_c0 = dVar20;
            }
            local_a0 = 4.94065645841247e-324;
            if (1 < (long)dVar16) {
              local_a0 = dVar16;
            }
            lVar22 = 0;
            iVar12 = local_d8._0_4_;
            local_78 = dVar20;
            do {
              if (iVar12 != 0x1f) {
                dVar16 = (double)(lVar22 << 4);
                local_b8 = 0.0;
                dVar17 = 0.0;
                local_108 = dVar16;
                local_e0 = lVar22;
                do {
                  local_f0 = dVar17;
                  if (local_100->controlState_ == 1) {
                    if ((long)local_e8 <= (long)dVar17 % local_110) goto LAB_00120759;
                  }
                  else if ((local_100->controlState_ != 0) ||
                          ((long)dVar17 % local_110 < (long)local_e8)) {
LAB_00120759:
                    dVar17 = local_c0;
                    dVar21 = local_b8;
                    if ((int)local_c8 != 0x1f) {
                      do {
                        pcVar2 = (pSVar11->data_)._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                        puVar1 = (undefined8 *)
                                 (pcVar2[pSVar11->size_ * (long)dVar21]._M_value + (long)dVar16);
                        local_88._M_value._0_8_ = *puVar1;
                        local_88._M_value._8_8_ = puVar1[1];
                        puVar1 = (undefined8 *)
                                 (pcVar2[pSVar11->size_ * ((long)dVar20 + (long)dVar21)]._M_value +
                                 (long)dVar16);
                        local_68._M_value._0_8_ = *puVar1;
                        local_68._M_value._8_8_ = puVar1[1];
                        local_138 = *(double *)
                                     local_120.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl;
                        dStack_130 = *(double *)
                                      ((long)local_120.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                             .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                             _M_head_impl + 8);
                        std::complex<double>::operator*=((complex<double> *)&local_138,&local_88);
                        local_98 = local_138;
                        dStack_90 = dStack_130;
                        local_138 = *(double *)
                                     ((complex<double> *)
                                     ((long)local_120.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + 0x10))->_M_value;
                        dStack_130 = *(double *)
                                      ((long)local_120.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                             .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                             _M_head_impl + 0x18);
                        std::complex<double>::operator*=((complex<double> *)&local_138,&local_68);
                        auVar3._8_4_ = SUB84(dStack_90 + dStack_130,0);
                        auVar3._0_8_ = local_98 + local_138;
                        auVar3._12_4_ = (int)((ulong)(dStack_90 + dStack_130) >> 0x20);
                        *(undefined1 (*) [16])
                         ((pSVar11->data_)._M_t.
                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          [pSVar11->size_ * (long)dVar21]._M_value + (long)local_108) = auVar3;
                        local_138 = *(double *)
                                     ((complex<double> *)
                                     ((long)local_120.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + local_120.size_ * 0x10))->_M_value;
                        dStack_130 = *(double *)
                                      ((long)((complex<double> *)
                                             ((long)local_120.data_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + local_120.size_ * 0x10))->_M_value
                                      + 8);
                        std::complex<double>::operator*=((complex<double> *)&local_138,&local_88);
                        local_98 = local_138;
                        dStack_90 = dStack_130;
                        local_138 = *(double *)
                                     ((complex<double> *)
                                     ((long)local_120.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + 0x10))[local_120.size_]._M_value;
                        dStack_130 = *(double *)
                                      ((long)((complex<double> *)
                                             ((long)local_120.data_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x10))[local_120.size_]._M_value +
                                      8);
                        std::complex<double>::operator*=((complex<double> *)&local_138,&local_68);
                        auVar4._8_4_ = SUB84(dStack_90 + dStack_130,0);
                        auVar4._0_8_ = local_98 + local_138;
                        auVar4._12_4_ = (int)((ulong)(dStack_90 + dStack_130) >> 0x20);
                        *(undefined1 (*) [16])
                         ((pSVar11->data_)._M_t.
                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          [((long)dVar20 + (long)dVar21) * pSVar11->size_]._M_value +
                         (long)local_108) = auVar4;
                        dVar17 = (double)((long)dVar17 + -1);
                        dVar20 = local_78;
                        dVar16 = local_108;
                        dVar21 = (double)((long)dVar21 + 1);
                      } while (dVar17 != 0.0);
                    }
                  }
                  dVar17 = (double)((long)local_f0 + 1);
                  local_b8 = (double)((long)local_b8 + (long)local_d0);
                } while (dVar17 != local_a0);
                lVar15 = local_f8->size_;
                lVar22 = local_e0;
                iVar12 = local_d8._0_4_;
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 < lVar15);
          }
        }
        else if (0 < lVar15) {
          local_e8 = (double)(long)(iVar13 / 2);
          local_c0 = 4.94065645841247e-324;
          if (1 < (long)dVar20) {
            local_c0 = dVar20;
          }
          local_d0 = 4.94065645841247e-324;
          if (1 < (long)dVar16) {
            local_d0 = dVar16;
          }
          local_a0 = (double)((long)dVar20 << 5);
          dVar20 = (double)((long)dVar20 << 4);
          dVar16 = 0.0;
          lVar22 = 0;
          iVar12 = local_d8._0_4_;
          local_78 = dVar20;
          do {
            if (iVar12 != 0x1f) {
              local_b8 = 0.0;
              dVar17 = 0.0;
              local_108 = dVar16;
              local_e0 = lVar22;
              do {
                local_f0 = dVar17;
                if (local_100->controlState_ == 1) {
                  if ((long)local_e8 <= (long)dVar17 % local_110) goto LAB_00120f3d;
                }
                else if ((local_100->controlState_ != 0) ||
                        ((long)dVar17 % local_110 < (long)local_e8)) {
LAB_00120f3d:
                  dVar17 = local_c0;
                  dVar21 = local_b8;
                  if ((int)local_c8 != 0x1f) {
                    do {
                      lVar15 = pSVar11->size_ * (long)dVar16;
                      pcVar2 = (pSVar11->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      puVar1 = (undefined8 *)(pcVar2->_M_value + (long)dVar21 + lVar15);
                      local_88._M_value._0_8_ = *puVar1;
                      local_88._M_value._8_8_ = puVar1[1];
                      puVar1 = (undefined8 *)
                               (pcVar2->_M_value + (long)dVar20 + (long)dVar21 + lVar15);
                      local_68._M_value._0_8_ = *puVar1;
                      local_68._M_value._8_8_ = puVar1[1];
                      local_138 = *(double *)
                                   local_120.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl;
                      dStack_130 = *(double *)
                                    ((long)local_120.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl + 8);
                      std::complex<double>::operator*=((complex<double> *)&local_138,&local_88);
                      local_98 = local_138;
                      dStack_90 = dStack_130;
                      pcVar2 = (complex<double> *)
                               ((long)local_120.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                      .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                      _M_head_impl + local_120.size_ * 0x10);
                      local_138 = *(double *)pcVar2->_M_value;
                      dStack_130 = *(double *)((long)pcVar2->_M_value + 8);
                      std::complex<double>::operator*=((complex<double> *)&local_138,&local_68);
                      auVar5._8_4_ = SUB84(dStack_90 + dStack_130,0);
                      auVar5._0_8_ = local_98 + local_138;
                      auVar5._12_4_ = (int)((ulong)(dStack_90 + dStack_130) >> 0x20);
                      *(undefined1 (*) [16])
                       (((pSVar11->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->
                        _M_value + (long)dVar21 + pSVar11->size_ * (long)local_108) = auVar5;
                      local_138 = *(double *)
                                   ((complex<double> *)
                                   ((long)local_120.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + 0x10))->_M_value;
                      dStack_130 = *(double *)
                                    ((long)((complex<double> *)
                                           ((long)local_120.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x10))->_M_value + 8);
                      std::complex<double>::operator*=((complex<double> *)&local_138,&local_88);
                      local_98 = local_138;
                      dStack_90 = dStack_130;
                      local_138 = *(double *)
                                   ((complex<double> *)
                                   ((long)local_120.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + 0x10))[local_120.size_]._M_value;
                      dStack_130 = *(double *)
                                    ((long)((complex<double> *)
                                           ((long)local_120.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x10))[local_120.size_]._M_value +
                                    8);
                      std::complex<double>::operator*=((complex<double> *)&local_138,&local_68);
                      auVar6._8_4_ = SUB84(dStack_90 + dStack_130,0);
                      auVar6._0_8_ = local_98 + local_138;
                      auVar6._12_4_ = (int)((ulong)(dStack_90 + dStack_130) >> 0x20);
                      *(undefined1 (*) [16])
                       (((pSVar11->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->
                        _M_value + (long)dVar21 + (long)local_78 + pSVar11->size_ * (long)local_108)
                           = auVar6;
                      dVar17 = (double)((long)dVar17 + -1);
                      dVar16 = local_108;
                      dVar20 = local_78;
                      dVar21 = (double)((long)dVar21 + 0x10);
                    } while (dVar17 != 0.0);
                  }
                }
                dVar17 = (double)((long)local_f0 + 1);
                local_b8 = (double)((long)local_b8 + (long)local_a0);
              } while (dVar17 != local_d0);
              lVar15 = local_f8->size_;
              lVar22 = local_e0;
              iVar12 = local_d8._0_4_;
            }
            lVar22 = lVar22 + 1;
            dVar16 = (double)((long)dVar16 + 0x10);
          } while (lVar22 < lVar15);
        }
      }
      else {
        iVar19 = 1 << ((byte)nbQubits - (char)local_100->control_ & 0x1f);
        iVar13 = (*(local_100->super_QGate2<std::complex<double>_>).
                   super_QObject<std::complex<double>_>._vptr_QObject[0xf])(local_100);
        local_e0 = CONCAT44(local_e0._4_4_,iVar13);
        uVar14 = (*(pQVar18->super_QGate2<std::complex<double>_>).
                   super_QObject<std::complex<double>_>._vptr_QObject[0xf])(pQVar18);
        pSVar11 = local_f8;
        local_98 = (double)(long)iVar19;
        iVar12 = ~uVar14 + nbQubits;
        dVar20 = (double)(long)(1 << ((byte)iVar13 & 0x1f));
        local_108 = (double)(long)(1 << ((byte)iVar12 & 0x1f));
        lVar15 = local_f8->size_;
        local_a0 = (double)CONCAT44(local_a0._4_4_,iVar12);
        if (side == Left) {
          if (0 < lVar15) {
            local_c0 = (double)((long)local_108 * 2);
            local_d0 = (double)(long)(iVar19 / 2);
            local_f0 = 4.94065645841247e-324;
            if (1 < (long)local_108) {
              local_f0 = local_108;
            }
            local_d8 = 4.94065645841247e-324;
            if (1 < (long)dVar20) {
              local_d8 = dVar20;
            }
            lVar22 = 0;
            iVar13 = (int)local_e0;
            do {
              if (iVar13 != 0x1f) {
                local_78 = (double)(lVar22 << 4);
                local_110 = 0;
                dVar20 = 0.0;
                pQVar18 = local_100;
                local_50 = lVar22;
                do {
                  local_e8 = dVar20;
                  if (iVar12 != 0x1f) {
                    local_c8 = (long)local_108 + local_110;
                    dVar20 = 0.0;
                    do {
                      pSVar11 = local_f8;
                      if (pQVar18->controlState_ == 1) {
                        if ((long)local_d0 <= (long)dVar20 % (long)local_98) goto LAB_00120a5b;
                      }
                      else if ((pQVar18->controlState_ != 0) ||
                              ((long)dVar20 % (long)local_98 < (long)local_d0)) {
LAB_00120a5b:
                        lVar15 = local_110 + (long)dVar20;
                        lVar22 = local_c8 + (long)dVar20;
                        pcVar2 = (local_f8->data_)._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                        puVar1 = (undefined8 *)
                                 (pcVar2[local_f8->size_ * lVar15]._M_value + (long)local_78);
                        local_88._M_value._0_8_ = *puVar1;
                        local_88._M_value._8_8_ = puVar1[1];
                        puVar1 = (undefined8 *)
                                 (pcVar2[local_f8->size_ * lVar22]._M_value + (long)local_78);
                        local_68._M_value._0_8_ = *puVar1;
                        local_68._M_value._8_8_ = puVar1[1];
                        local_138 = *(double *)
                                     local_120.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl;
                        dStack_130 = *(double *)
                                      ((long)local_120.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                             .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                             _M_head_impl + 8);
                        std::complex<double>::operator*=((complex<double> *)&local_138,&local_88);
                        local_b8 = local_138;
                        dStack_b0 = dStack_130;
                        local_138 = *(double *)
                                     ((complex<double> *)
                                     ((long)local_120.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + 0x10))->_M_value;
                        dStack_130 = *(double *)
                                      ((long)((complex<double> *)
                                             ((long)local_120.data_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x10))->_M_value + 8);
                        std::complex<double>::operator*=((complex<double> *)&local_138,&local_68);
                        dVar16 = local_78;
                        auVar7._8_4_ = SUB84(dStack_b0 + dStack_130,0);
                        auVar7._0_8_ = local_b8 + local_138;
                        auVar7._12_4_ = (int)((ulong)(dStack_b0 + dStack_130) >> 0x20);
                        *(undefined1 (*) [16])
                         ((pSVar11->data_)._M_t.
                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          [lVar15 * pSVar11->size_]._M_value + (long)local_78) = auVar7;
                        pcVar2 = (complex<double> *)
                                 ((long)local_120.data_._M_t.
                                        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                        .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                        _M_head_impl + local_120.size_ * 0x10);
                        local_138 = *(double *)pcVar2->_M_value;
                        dStack_130 = *(double *)((long)pcVar2->_M_value + 8);
                        std::complex<double>::operator*=((complex<double> *)&local_138,&local_88);
                        local_b8 = local_138;
                        dStack_b0 = dStack_130;
                        local_138 = *(double *)
                                     ((complex<double> *)
                                     ((long)local_120.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + (local_120.size_ + 1) * 0x10))->_M_value;
                        dStack_130 = *(double *)
                                      ((long)((complex<double> *)
                                             ((long)local_120.data_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + (local_120.size_ + 1) * 0x10))->
                                             _M_value + 8);
                        std::complex<double>::operator*=((complex<double> *)&local_138,&local_68);
                        auVar8._8_4_ = SUB84(dStack_b0 + dStack_130,0);
                        auVar8._0_8_ = local_b8 + local_138;
                        auVar8._12_4_ = (int)((ulong)(dStack_b0 + dStack_130) >> 0x20);
                        *(undefined1 (*) [16])
                         ((pSVar11->data_)._M_t.
                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          [lVar22 * pSVar11->size_]._M_value + (long)dVar16) = auVar8;
                        pQVar18 = local_100;
                      }
                      dVar20 = (double)((long)dVar20 + 1);
                    } while (local_f0 != dVar20);
                  }
                  dVar20 = (double)((long)local_e8 + 1);
                  local_110 = local_110 + (long)local_c0;
                  iVar12 = local_a0._0_4_;
                } while (dVar20 != local_d8);
                lVar15 = local_f8->size_;
                lVar22 = local_50;
                iVar13 = (int)local_e0;
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 < lVar15);
          }
        }
        else if (0 < lVar15) {
          local_110 = (long)(iVar19 / 2);
          local_b8 = 4.94065645841247e-324;
          if (1 < (long)local_108) {
            local_b8 = local_108;
          }
          local_e8 = 4.94065645841247e-324;
          if (1 < (long)dVar20) {
            local_e8 = dVar20;
          }
          local_c0 = (double)((long)local_108 << 5);
          local_108 = (double)((long)local_108 << 4);
          local_f0 = 0.0;
          dVar20 = 0.0;
          iVar13 = (int)local_e0;
          do {
            if (iVar13 != 0x1f) {
              local_c8 = 0;
              dVar16 = 0.0;
              pQVar18 = local_100;
              local_d8 = dVar20;
              do {
                local_d0 = dVar16;
                if (iVar12 != 0x1f) {
                  dVar20 = 0.0;
                  lVar15 = local_c8;
                  do {
                    dVar16 = local_f0;
                    if (pQVar18->controlState_ == 1) {
                      if (local_110 <= (long)dVar20 % (long)local_98) goto LAB_00120ce9;
                    }
                    else if ((pQVar18->controlState_ != 0) ||
                            ((long)dVar20 % (long)local_98 < local_110)) {
LAB_00120ce9:
                      lVar22 = pSVar11->size_ * (long)local_f0;
                      pcVar2 = (pSVar11->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      puVar1 = (undefined8 *)(pcVar2->_M_value + lVar15 + lVar22);
                      local_88._M_value._0_8_ = *puVar1;
                      local_88._M_value._8_8_ = puVar1[1];
                      puVar1 = (undefined8 *)(pcVar2->_M_value + (long)local_108 + lVar15 + lVar22);
                      local_68._M_value._0_8_ = *puVar1;
                      local_68._M_value._8_8_ = puVar1[1];
                      local_138 = *(double *)
                                   local_120.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl;
                      dStack_130 = *(double *)
                                    ((long)local_120.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl + 8);
                      std::complex<double>::operator*=((complex<double> *)&local_138,&local_88);
                      local_78 = local_138;
                      dStack_70 = dStack_130;
                      pcVar2 = (complex<double> *)
                               ((long)local_120.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                      .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                      _M_head_impl + local_120.size_ * 0x10);
                      local_138 = *(double *)pcVar2->_M_value;
                      dStack_130 = *(double *)((long)pcVar2->_M_value + 8);
                      std::complex<double>::operator*=((complex<double> *)&local_138,&local_68);
                      auVar9._8_4_ = SUB84(dStack_70 + dStack_130,0);
                      auVar9._0_8_ = local_78 + local_138;
                      auVar9._12_4_ = (int)((ulong)(dStack_70 + dStack_130) >> 0x20);
                      *(undefined1 (*) [16])
                       (((pSVar11->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->
                        _M_value + lVar15 + pSVar11->size_ * (long)dVar16) = auVar9;
                      local_138 = *(double *)
                                   ((complex<double> *)
                                   ((long)local_120.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + 0x10))->_M_value;
                      dStack_130 = *(double *)
                                    ((long)local_120.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl + 0x18);
                      std::complex<double>::operator*=((complex<double> *)&local_138,&local_88);
                      local_78 = local_138;
                      dStack_70 = dStack_130;
                      local_138 = *(double *)
                                   ((complex<double> *)
                                   ((long)local_120.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + (local_120.size_ + 1) * 0x10))->_M_value;
                      dStack_130 = *(double *)
                                    ((long)((complex<double> *)
                                           ((long)local_120.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + (local_120.size_ + 1) * 0x10))->
                                           _M_value + 8);
                      std::complex<double>::operator*=((complex<double> *)&local_138,&local_68);
                      auVar10._8_4_ = SUB84(dStack_70 + dStack_130,0);
                      auVar10._0_8_ = local_78 + local_138;
                      auVar10._12_4_ = (int)((ulong)(dStack_70 + dStack_130) >> 0x20);
                      *(undefined1 (*) [16])
                       (((pSVar11->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->
                        _M_value + lVar15 + (long)local_108 + pSVar11->size_ * (long)dVar16) =
                           auVar10;
                      pQVar18 = local_100;
                    }
                    dVar20 = (double)((long)dVar20 + 1);
                    lVar15 = lVar15 + 0x10;
                  } while (local_b8 != dVar20);
                }
                dVar16 = (double)((long)local_d0 + 1);
                local_c8 = local_c8 + (long)local_c0;
                iVar12 = local_a0._0_4_;
              } while (dVar16 != local_e8);
              lVar15 = local_f8->size_;
              dVar20 = local_d8;
              iVar13 = (int)local_e0;
            }
            dVar20 = (double)((long)dVar20 + 1);
            local_f0 = (double)((long)local_f0 + 0x10);
          } while ((long)dVar20 < lVar15);
        }
      }
      if ((_Head_base<0UL,_std::complex<double>_*,_false>)
          local_120.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
          (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
        operator_delete__((void *)local_120.data_._M_t.
                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                         );
      }
      if (local_48[0] != (int *)0x0) {
        operator_delete(local_48[0],local_38 - (long)local_48[0]);
      }
      return;
    }
    __assertion = "qubits[1] < nbQubits";
  }
  else {
    __assertion = "qubits[0] < nbQubits";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                ,0x33,
                "virtual void qclab::qgates::QControlledGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
               );
}

Assistant:

void QControlledGate2< T >::apply( Side side , Op op , const int nbQubits ,
                                     qclab::dense::SquareMatrix< T >& matrix ,
                                     const int offset ) const {
    using matrix_type = qclab::dense::SquareMatrix< T > ;
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    // operation
    matrix_type  mat1 = this->gate()->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // control / target
    if ( control() < target() ) {
      // control() < target()
      const int64_t d = 1 << ( target() - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      // control() >= target()
      const int64_t d = 1 << ( nbQubits - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.cols(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              if ( controlState_ == 0 && ( j % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( j % d <  d/2 ) ) continue ;
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              if ( controlState_ == 0 && ( i % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( i % d <  d/2 ) ) continue ;
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }